

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::arraypool::~arraypool(arraypool *this)

{
  int local_14;
  int i;
  arraypool *this_local;
  
  if (this->toparray != (char **)0x0) {
    for (local_14 = 0; local_14 < this->toparraylen; local_14 = local_14 + 1) {
      if (this->toparray[local_14] != (char *)0x0) {
        free(this->toparray[local_14]);
      }
    }
    free(this->toparray);
  }
  this->toparray = (char **)0x0;
  this->toparraylen = 0;
  this->objects = 0;
  this->totalmemory = 0;
  return;
}

Assistant:

tetgenmesh::arraypool::~arraypool()
{
  int i;

  // Has anything been allocated at all?
  if (toparray != (char **) NULL) {
    // Walk through the top array.
    for (i = 0; i < toparraylen; i++) {
      // Check every pointer; NULLs may be scattered randomly.
      if (toparray[i] != (char *) NULL) {
        // Free an allocated block.
        free((void *) toparray[i]);
      }
    }
    // Free the top array.
    free((void *) toparray);
  }

  // The top array is no longer allocated.
  toparray = (char **) NULL;
  toparraylen = 0;
  objects = 0;
  totalmemory = 0;
}